

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TPM2_GetCapability(TSS_DEVICE *tpm,TPM_CAP capability,UINT32 property,UINT32 propertyCount,
                         TPMI_YES_NO *moreData,TPMS_CAPABILITY_DATA *capabilityData)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  void *p_2;
  void *p_1;
  void *p;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT *pTStack_3068;
  INT32 sizeParamBuf;
  TSS_CMD_CONTEXT *cmdCtx;
  undefined1 local_3058 [4];
  TPM_RC cmdResult;
  TSS_CMD_CONTEXT CmdCtx;
  TPMS_CAPABILITY_DATA *capabilityData_local;
  TPMI_YES_NO *moreData_local;
  UINT32 local_20;
  UINT32 propertyCount_local;
  UINT32 property_local;
  TPM_CAP capability_local;
  TSS_DEVICE *tpm_local;
  
  cmdCtx._4_4_ = 0;
  pTStack_3068 = (TSS_CMD_CONTEXT *)local_3058;
  paramBuf._4_4_ = 0x1000;
  p = &cmdResult;
  local_3058 = (undefined1  [4])0x0;
  CmdCtx._12312_8_ = capabilityData;
  moreData_local._4_4_ = propertyCount;
  local_20 = property;
  propertyCount_local = capability;
  _property_local = tpm;
  UVar1 = UINT32_Marshal(&propertyCount_local,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3068->ParamSize = (uint)UVar1 + pTStack_3068->ParamSize;
  UVar1 = UINT32_Marshal(&local_20,(BYTE **)&p,(INT32 *)((long)&paramBuf + 4));
  pTStack_3068->ParamSize = (uint)UVar1 + pTStack_3068->ParamSize;
  UVar1 = UINT32_Marshal((UINT32 *)((long)&moreData_local + 4),(BYTE **)&p,
                         (INT32 *)((long)&paramBuf + 4));
  pTStack_3068->ParamSize = (uint)UVar1 + pTStack_3068->ParamSize;
  cmdCtx._4_4_ = TSS_DispatchCmd(_property_local,0x17a,(TPM_HANDLE *)0x0,0,(TSS_SESSION **)0x0,0,
                                 pTStack_3068);
  tpm_local._4_4_ = cmdCtx._4_4_;
  if (cmdCtx._4_4_ == 0) {
    TVar2 = TPMI_YES_NO_Unmarshal
                      (moreData,&pTStack_3068->RespBufPtr,(INT32 *)&pTStack_3068->RespBytesLeft);
    if (TVar2 == 0) {
      TVar2 = TPMS_CAPABILITY_DATA_Unmarshal
                        ((TPMS_CAPABILITY_DATA *)CmdCtx._12312_8_,&pTStack_3068->RespBufPtr,
                         (INT32 *)&pTStack_3068->RespBytesLeft);
      if (TVar2 == 0) {
        tpm_local._4_4_ = cmdCtx._4_4_;
      }
      else {
        tpm_local._4_4_ = 0x9a;
      }
    }
    else {
      tpm_local._4_4_ = 0x9a;
    }
  }
  return tpm_local._4_4_;
}

Assistant:

TPM_RC
TPM2_GetCapability(
    TSS_DEVICE             *tpm,                // IN/OUT
    TPM_CAP                 capability,         // IN
    UINT32                  property,           // IN
    UINT32                  propertyCount,      // IN
    TPMI_YES_NO            *moreData,           // OUT
    TPMS_CAPABILITY_DATA   *capabilityData      // OUT
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL(TPM_CAP, &capability);
    TSS_MARSHAL(UINT32, &property);
    TSS_MARSHAL(UINT32, &propertyCount);
    DISPATCH_CMD(GetCapability, NULL, 0, NULL, 0);
    TSS_UNMARSHAL(TPMI_YES_NO, moreData);
    TSS_UNMARSHAL(TPMS_CAPABILITY_DATA, capabilityData);
    END_CMD();
}